

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O3

bool __thiscall
tlx::CmdlineParser::ArgumentFloat::process(ArgumentFloat *this,int *argc,char ***argv)

{
  bool bVar1;
  char *in_RAX;
  float fVar2;
  char *endptr;
  char *local_28;
  
  if (*argc != 0) {
    local_28 = in_RAX;
    fVar2 = strtof(**argv,&local_28);
    *this->dest_ = fVar2;
    if ((local_28 == (char *)0x0) || (*local_28 != '\0')) {
      bVar1 = false;
    }
    else {
      *argc = *argc + -1;
      *argv = *argv + 1;
      bVar1 = true;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        char* endptr;
        dest_ = strtof(argv[0], &endptr);
        if (endptr != nullptr && *endptr == 0) {
            --argc, ++argv;
            return true;
        }
        else {
            return false;
        }
    }